

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_object.cpp:53:35)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_number_object_cpp:53:35)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  value *v;
  double val;
  gc_heap_ptr_untyped local_30;
  gc_heap_ptr_untyped local_20;
  
  gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_30,(gc_heap_ptr_untyped *)&this->f);
  v = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_start;
  if (v == (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_finish) {
    val = 0.0;
  }
  else {
    val = to_number(v);
  }
  new_number((mjs *)&local_20,(object_ptr *)&local_30,val);
  value::value(__return_storage_ptr__,(object_ptr *)&local_20);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_20);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_30);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }